

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  CollSeq *pColl_00;
  CollSeq *pColl;
  int iBest;
  int mask;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  pvVar4 = sqlite3_user_data(context);
  uVar1 = 0xffffffff;
  if (pvVar4 == (void *)0x0) {
    uVar1 = 0;
  }
  pColl_00 = sqlite3GetFuncCollSeq(context);
  pColl._4_4_ = 0;
  iVar2 = sqlite3_value_type(*argv);
  if (iVar2 != 5) {
    for (iBest = 1; iBest < argc; iBest = iBest + 1) {
      iVar2 = sqlite3_value_type(argv[iBest]);
      if (iVar2 == 5) {
        return;
      }
      uVar3 = sqlite3MemCompare(argv[pColl._4_4_],argv[iBest],pColl_00);
      if (-1 < (int)(uVar3 ^ uVar1)) {
        pColl._4_4_ = iBest;
      }
    }
    sqlite3_result_value(context,argv[pColl._4_4_]);
  }
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}